

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * sx_os_path_normpath(char *dst,int size,char *path)

{
  char *pcVar1;
  char *path_local;
  int size_local;
  char *dst_local;
  
  pcVar1 = sx_os_path_unixpath(dst,size,path);
  return pcVar1;
}

Assistant:

char* sx_os_path_normpath(char* dst, int size, const char* path)
{
#if SX_PLATFORM_WINDOWS
    return sx_tolower(dst, size, sx_os_path_winpath(dst, size, path));
#elif SX_PLATFORM_APPLE
    return sx_tolower(dst, size, sx_os_path_unixpath(dst, size, path));
#else
    return sx_os_path_unixpath(dst, size, path);
#endif
}